

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O2

void __thiscall
sqvector<SQObjectPtr>::insert(sqvector<SQObjectPtr> *this,SQUnsignedInteger idx,SQObjectPtr *val)

{
  SQObjectPtr *pSVar1;
  SQUnsignedInteger SVar2;
  long lVar3;
  SQObjectPtr local_38;
  
  local_38.super_SQObject._type = OT_NULL;
  local_38.super_SQObject._unVal.pTable = (SQTable *)0x0;
  resize(this,this->_size + 1,&local_38);
  SQObjectPtr::~SQObjectPtr(&local_38);
  SVar2 = this->_size;
  lVar3 = SVar2 * 0x10 + -0x20;
  while( true ) {
    SVar2 = SVar2 - 1;
    pSVar1 = this->_vals;
    if (SVar2 <= idx) break;
    SQObjectPtr::operator=
              ((SQObjectPtr *)((long)&pSVar1[1].super_SQObject._type + lVar3),
               (SQObjectPtr *)((long)&(pSVar1->super_SQObject)._type + lVar3));
    lVar3 = lVar3 + -0x10;
  }
  SQObjectPtr::operator=(pSVar1 + idx,val);
  return;
}

Assistant:

void insert(SQUnsignedInteger idx, const T& val)
    {
        resize(_size + 1);
        for(SQUnsignedInteger i = _size - 1; i > idx; i--) {
            _vals[i] = _vals[i - 1];
        }
        _vals[idx] = val;
    }